

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes_Grp4.c
# Opt level: O2

void G4_Eb(PDISASM pMyDisasm)

{
  REGISTERTYPE *pRVar1;
  Int64 *pIVar2;
  byte bVar3;
  UInt8 UVar4;
  UInt8 UVar5;
  UInt8 UVar6;
  UInt8 UVar7;
  UInt8 UVar8;
  UInt8 UVar9;
  UInt8 UVar10;
  int iVar11;
  uint uVar12;
  undefined4 uVar13;
  
  iVar11 = Security(2,pMyDisasm);
  if (iVar11 != 0) {
    bVar3 = *(byte *)((pMyDisasm->Reserved_).EIP_ + 1) >> 3;
    uVar12 = bVar3 & 7;
    (pMyDisasm->Reserved_).REGOPCODE = uVar12;
    if (uVar12 == 1) {
      if ((pMyDisasm->Prefix).LockPrefix == '\x04') {
        (pMyDisasm->Prefix).LockPrefix = '\x01';
      }
      (pMyDisasm->Instruction).Category = 0x10002;
      builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"dec",4);
      Eb(pMyDisasm);
      if (((pMyDisasm->Prefix).LockPrefix == '\x01') && ((pMyDisasm->Reserved_).MOD_ == 3)) {
        (pMyDisasm->Reserved_).ERROR_OPCODE = 2;
      }
      pRVar1 = &(pMyDisasm->Instruction).ImplicitModifiedRegs;
      *(byte *)&pRVar1->type = (byte)pRVar1->type | 0x20;
      pIVar2 = &(pMyDisasm->Instruction).ImplicitModifiedRegs.special;
      *(byte *)pIVar2 = (byte)*pIVar2 | 1;
      UVar4 = EFLAGS_TABLE[0x1e].SF_;
      UVar5 = EFLAGS_TABLE[0x1e].ZF_;
      UVar6 = EFLAGS_TABLE[0x1e].AF_;
      UVar7 = EFLAGS_TABLE[0x1e].PF_;
      UVar8 = EFLAGS_TABLE[0x1e].CF_;
      UVar9 = EFLAGS_TABLE[0x1e].TF_;
      UVar10 = EFLAGS_TABLE[0x1e].IF_;
      (pMyDisasm->Instruction).Flags.OF_ = EFLAGS_TABLE[0x1e].OF_;
      (pMyDisasm->Instruction).Flags.SF_ = UVar4;
      (pMyDisasm->Instruction).Flags.ZF_ = UVar5;
      (pMyDisasm->Instruction).Flags.AF_ = UVar6;
      (pMyDisasm->Instruction).Flags.PF_ = UVar7;
      (pMyDisasm->Instruction).Flags.CF_ = UVar8;
      (pMyDisasm->Instruction).Flags.TF_ = UVar9;
      (pMyDisasm->Instruction).Flags.IF_ = UVar10;
      uVar13 = EFLAGS_TABLE[0x1e]._8_4_;
    }
    else {
      if ((bVar3 & 7) != 0) {
        failDecode(pMyDisasm);
        return;
      }
      if ((pMyDisasm->Prefix).LockPrefix == '\x04') {
        (pMyDisasm->Prefix).LockPrefix = '\x01';
      }
      (pMyDisasm->Instruction).Category = 0x10002;
      builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"inc",4);
      Eb(pMyDisasm);
      (pMyDisasm->Operand1).AccessMode = 3;
      if (((pMyDisasm->Prefix).LockPrefix == '\x01') && ((pMyDisasm->Reserved_).MOD_ == 3)) {
        (pMyDisasm->Reserved_).ERROR_OPCODE = 2;
      }
      pRVar1 = &(pMyDisasm->Instruction).ImplicitModifiedRegs;
      *(byte *)&pRVar1->type = (byte)pRVar1->type | 0x20;
      pIVar2 = &(pMyDisasm->Instruction).ImplicitModifiedRegs.special;
      *(byte *)pIVar2 = (byte)*pIVar2 | 1;
      UVar4 = EFLAGS_TABLE[0x28].SF_;
      UVar5 = EFLAGS_TABLE[0x28].ZF_;
      UVar6 = EFLAGS_TABLE[0x28].AF_;
      UVar7 = EFLAGS_TABLE[0x28].PF_;
      UVar8 = EFLAGS_TABLE[0x28].CF_;
      UVar9 = EFLAGS_TABLE[0x28].TF_;
      UVar10 = EFLAGS_TABLE[0x28].IF_;
      (pMyDisasm->Instruction).Flags.OF_ = EFLAGS_TABLE[0x28].OF_;
      (pMyDisasm->Instruction).Flags.SF_ = UVar4;
      (pMyDisasm->Instruction).Flags.ZF_ = UVar5;
      (pMyDisasm->Instruction).Flags.AF_ = UVar6;
      (pMyDisasm->Instruction).Flags.PF_ = UVar7;
      (pMyDisasm->Instruction).Flags.CF_ = UVar8;
      (pMyDisasm->Instruction).Flags.TF_ = UVar9;
      (pMyDisasm->Instruction).Flags.IF_ = UVar10;
      uVar13 = EFLAGS_TABLE[0x28]._8_4_;
    }
    (pMyDisasm->Instruction).Flags.DF_ = (UInt8)uVar13;
    (pMyDisasm->Instruction).Flags.NT_ = SUB41(uVar13,1);
    (pMyDisasm->Instruction).Flags.RF_ = SUB41(uVar13,2);
    (pMyDisasm->Instruction).Flags.alignment = SUB41(uVar13,3);
  }
  return;
}

Assistant:

void __bea_callspec__ G4_Eb(PDISASM pMyDisasm)
{
    if (!Security(2, pMyDisasm)) return;
    GV.REGOPCODE = ((*((UInt8*) (GV.EIP_+1))) >> 3) & 0x7;
    if (GV.REGOPCODE == 0) {
        if (pMyDisasm->Prefix.LockPrefix == InvalidPrefix) {
            pMyDisasm->Prefix.LockPrefix = InUsePrefix;
        }
        pMyDisasm->Instruction.Category = GENERAL_PURPOSE_INSTRUCTION+ARITHMETIC_INSTRUCTION;
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "inc");
        #endif
        Eb(pMyDisasm);
        pMyDisasm->Operand1.AccessMode = READ + WRITE;
        if ((pMyDisasm->Prefix.LockPrefix == InUsePrefix) && (GV.MOD_ == 0x3)) {
            GV.ERROR_OPCODE = UD_;
        }
        FillFlags(pMyDisasm, 40);
    }
    else if (GV.REGOPCODE == 1) {
        if (pMyDisasm->Prefix.LockPrefix == InvalidPrefix) {
            pMyDisasm->Prefix.LockPrefix = InUsePrefix;
        }
        pMyDisasm->Instruction.Category = GENERAL_PURPOSE_INSTRUCTION+ARITHMETIC_INSTRUCTION;
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "dec");
        #endif
        Eb(pMyDisasm);
        if ((pMyDisasm->Prefix.LockPrefix == InUsePrefix) && (GV.MOD_ == 0x3)) {
            GV.ERROR_OPCODE = UD_;
        }
        FillFlags(pMyDisasm, 30);
    }
    else {
        failDecode(pMyDisasm);
    }
}